

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O0

long vorbis_book_decodevs_add(codebook *book,float *a,oggpack_buffer *b,int n)

{
  oggpack_buffer *b_00;
  long lVar1;
  float *pfVar2;
  undefined8 uStack_60;
  float *pfStack_58;
  int local_4c;
  int local_48;
  int o;
  int j;
  int i;
  float **t;
  long *entry;
  int step;
  int n_local;
  oggpack_buffer *b_local;
  float *a_local;
  codebook *book_local;
  
  if (0 < book->used_entries) {
    entry._0_4_ = (int)((long)n / book->dim);
    t = (float **)((long)&pfStack_58 - ((long)(int)entry * 8 + 0xfU & 0xfffffffffffffff0));
    lVar1 = (long)t - ((long)(int)entry * 8 + 0xfU & 0xfffffffffffffff0);
    _j = lVar1;
    entry._4_4_ = n;
    _step = b;
    b_local = (oggpack_buffer *)a;
    a_local = (float *)book;
    for (o = 0; pfVar2 = a_local, b_00 = _step, o < (int)entry; o = o + 1) {
      *(undefined8 *)(lVar1 + -8) = 0x2c1bef;
      pfVar2 = (float *)decode_packed_entry_number((codebook *)pfVar2,b_00);
      t[o] = pfVar2;
      if (t[o] == (float *)0xffffffffffffffff) {
        return -1;
      }
      *(long *)(_j + (long)o * 8) = *(long *)(a_local + 8) + (long)t[o] * *(long *)a_local * 4;
    }
    local_4c = 0;
    for (o = 0; (long)o < *(long *)a_local; o = o + 1) {
      for (local_48 = 0; local_4c + local_48 < entry._4_4_ && local_48 < (int)entry;
          local_48 = local_48 + 1) {
        *(float *)((long)&b_local->endbyte + (long)(local_4c + local_48) * 4) =
             *(float *)(*(long *)(_j + (long)local_48 * 8) + (long)o * 4) +
             *(float *)((long)&b_local->endbyte + (long)(local_4c + local_48) * 4);
      }
      local_4c = (int)entry + local_4c;
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodevs_add(codebook *book,float *a,oggpack_buffer *b,int n){
  if(book->used_entries>0){
    int step=n/book->dim;
    long *entry = alloca(sizeof(*entry)*step);
    float **t = alloca(sizeof(*t)*step);
    int i,j,o;

    for (i = 0; i < step; i++) {
      entry[i]=decode_packed_entry_number(book,b);
      if(entry[i]==-1)return(-1);
      t[i] = book->valuelist+entry[i]*book->dim;
    }
    for(i=0,o=0;i<book->dim;i++,o+=step)
      for (j=0;o+j<n && j<step;j++)
        a[o+j]+=t[j][i];
  }
  return(0);
}